

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.h
# Opt level: O0

void __thiscall
slang::ast::RangeSelectExpression::visitExprs<slang::analysis::SampledValueFuncVisitor&>
          (RangeSelectExpression *this,SampledValueFuncVisitor *visitor)

{
  Expression *in_RSI;
  RangeSelectExpression *in_RDI;
  
  value(in_RDI);
  Expression::visit<slang::analysis::SampledValueFuncVisitor&>
            (in_RSI,(SampledValueFuncVisitor *)in_RDI);
  left(in_RDI);
  Expression::visit<slang::analysis::SampledValueFuncVisitor&>
            (in_RSI,(SampledValueFuncVisitor *)in_RDI);
  right(in_RDI);
  Expression::visit<slang::analysis::SampledValueFuncVisitor&>
            (in_RSI,(SampledValueFuncVisitor *)in_RDI);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        value().visit(visitor);
        left().visit(visitor);
        right().visit(visitor);
    }